

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

SUNErrCode N_VLinearCombination_Serial(int nvec,sunrealtype *c,N_Vector *X,N_Vector z)

{
  N_Vector x;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  x = *X;
  if (nvec == 2) {
    N_VLinearSum_Serial(*c,x,c[1],X[1],z);
  }
  else if (nvec == 1) {
    N_VScale_Serial(*c,x,z);
  }
  else {
    lVar4 = *z->content;
    lVar1 = *(long *)((long)z->content + 0x10);
    if (x == z) {
      lVar3 = 0;
      if (0 < lVar4) {
        lVar3 = lVar4;
      }
      if ((*c != 1.0) || (NAN(*c))) {
        for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
          *(double *)(lVar1 + lVar4 * 8) = *c * *(double *)(lVar1 + lVar4 * 8);
        }
        for (lVar4 = 1; lVar4 < nvec; lVar4 = lVar4 + 1) {
          lVar2 = *(long *)((long)X[lVar4]->content + 0x10);
          for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
            *(double *)(lVar1 + lVar5 * 8) =
                 c[lVar4] * *(double *)(lVar2 + lVar5 * 8) + *(double *)(lVar1 + lVar5 * 8);
          }
        }
      }
      else {
        for (lVar4 = 1; lVar4 < nvec; lVar4 = lVar4 + 1) {
          lVar2 = *(long *)((long)X[lVar4]->content + 0x10);
          for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
            *(double *)(lVar1 + lVar5 * 8) =
                 c[lVar4] * *(double *)(lVar2 + lVar5 * 8) + *(double *)(lVar1 + lVar5 * 8);
          }
        }
      }
    }
    else {
      lVar3 = *(long *)((long)x->content + 0x10);
      lVar2 = 0;
      if (lVar4 < 1) {
        lVar4 = lVar2;
      }
      for (; lVar4 != lVar2; lVar2 = lVar2 + 1) {
        *(double *)(lVar1 + lVar2 * 8) = *c * *(double *)(lVar3 + lVar2 * 8);
      }
      for (lVar3 = 1; lVar3 < nvec; lVar3 = lVar3 + 1) {
        lVar2 = *(long *)((long)X[lVar3]->content + 0x10);
        for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
          *(double *)(lVar1 + lVar5 * 8) =
               c[lVar3] * *(double *)(lVar2 + lVar5 * 8) + *(double *)(lVar1 + lVar5 * 8);
        }
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VLinearCombination_Serial(int nvec, sunrealtype* c, N_Vector* X,
                                       N_Vector z)
{
  SUNFunctionBegin(X[0]->sunctx);

  int i;
  sunindextype j, N;
  sunrealtype* zd = NULL;
  sunrealtype* xd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VScale */
  if (nvec == 1)
  {
    N_VScale_Serial(c[0], X[0], z);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* should have called N_VLinearSum */
  if (nvec == 2)
  {
    N_VLinearSum_Serial(c[0], X[0], c[1], X[1], z);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  /*
   * X[0] += c[i]*X[i], i = 1,...,nvec-1
   */
  if ((X[0] == z) && (c[0] == ONE))
  {
    for (i = 1; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < N; j++) { zd[j] += c[i] * xd[j]; }
    }
    return SUN_SUCCESS;
  }

  /*
   * X[0] = c[0] * X[0] + sum{ c[i] * X[i] }, i = 1,...,nvec-1
   */
  if (X[0] == z)
  {
    for (j = 0; j < N; j++) { zd[j] *= c[0]; }
    for (i = 1; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < N; j++) { zd[j] += c[i] * xd[j]; }
    }
    return SUN_SUCCESS;
  }

  /*
   * z = sum{ c[i] * X[i] }, i = 0,...,nvec-1
   */
  xd = NV_DATA_S(X[0]);
  for (j = 0; j < N; j++) { zd[j] = c[0] * xd[j]; }
  for (i = 1; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    for (j = 0; j < N; j++) { zd[j] += c[i] * xd[j]; }
  }
  return SUN_SUCCESS;
}